

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_mesh.cpp
# Opt level: O0

bool __thiscall
ON_Mesh::CombineIdenticalVertices
          (ON_Mesh *this,bool bIgnoreVertexNormals,bool bIgnoreTextureCoordinates)

{
  undefined8 uVar1;
  ON_MeshNgon *pOVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int *index_00;
  ON_3fPoint *pOVar7;
  ON_3fPoint *pOVar8;
  ON_3dPoint *pOVar9;
  ON_3dPoint *pOVar10;
  undefined8 *puVar11;
  ON_SurfaceCurvature *pOVar12;
  ON_MeshFace *pOVar13;
  ON_MeshFace *pOVar14;
  ON_MeshNgon **ppOVar15;
  ON_3dPoint *pOVar16;
  undefined8 *puVar17;
  double *pdVar18;
  ON_SurfaceCurvature *local_258;
  ON_SurfaceCurvature *local_240;
  ON_3fPoint *local_228;
  ON_3fVector *local_210;
  ON_SurfaceCurvature *local_1e8;
  ON_SurfaceCurvature *local_1d0;
  ON_3fPoint *local_1b8;
  ON_3fVector *local_1a0;
  uint local_174;
  uint ngon_vertex_index;
  ON_MeshNgon *ngon;
  int ngon_index;
  int *fvi;
  ON_MeshFace *f;
  int face_count;
  ON_SurfaceCurvature *s;
  ON_SimpleArray<ON_SurfaceCurvature> s_array;
  ON_Color *c;
  ON_SimpleArray<ON_Color> c_array;
  ON_3dPoint *D;
  ON_3dPoint *dp;
  ON_SimpleArray<ON_3dPoint> dp_array;
  ON_3fVector *v;
  ON_3fPoint *p;
  ON_SimpleArray<ON_3fPoint> p_array;
  int *remap;
  int *index;
  tagMESHPOINTS mp;
  int k;
  int i1;
  int i0;
  int merge_count;
  int remap_vertex_count;
  undefined1 local_58 [8];
  ON_SimpleArray<int> remap_array;
  ON_SimpleArray<int> index_array;
  int vertex_count;
  ON_Mesh *mesh;
  bool rc;
  bool bIgnoreTextureCoordinates_local;
  bool bIgnoreVertexNormals_local;
  ON_Mesh *this_local;
  
  mesh._5_1_ = false;
  iVar4 = ON_SimpleArray<ON_3fPoint>::Count(&(this->m_V).super_ON_SimpleArray<ON_3fPoint>);
  if (0 < iVar4) {
    ON_SimpleArray<int>::ON_SimpleArray((ON_SimpleArray<int> *)&remap_array.m_count,(long)iVar4);
    ON_SimpleArray<int>::ON_SimpleArray((ON_SimpleArray<int> *)local_58,(long)iVar4);
    i0 = 0;
    mp.N = (ON_3fVector *)0x0;
    mp.K = (ON_SurfaceCurvature *)0x0;
    mp.V = (ON_3fPoint *)0x0;
    mp.T = (ON_2fPoint *)0x0;
    mp.p0 = (char *)0x0;
    index = (int *)&index;
    mp.p0 = (char *)ON_SimpleArray<ON_3fPoint>::Array(&(this->m_V).super_ON_SimpleArray<ON_3fPoint>)
    ;
    bVar3 = HasVertexNormals(this);
    if (bVar3) {
      local_1a0 = ON_SimpleArray<ON_3fVector>::Array(&(this->m_N).super_ON_SimpleArray<ON_3fVector>)
      ;
    }
    else {
      local_1a0 = (ON_3fVector *)0x0;
    }
    mp.T = (ON_2fPoint *)local_1a0;
    bVar3 = HasTextureCoordinates(this);
    if (bVar3) {
      local_1b8 = (ON_3fPoint *)
                  ON_SimpleArray<ON_2fPoint>::Array(&(this->m_T).super_ON_SimpleArray<ON_2fPoint>);
    }
    else {
      local_1b8 = (ON_3fPoint *)0x0;
    }
    mp.V = local_1b8;
    bVar3 = HasVertexColors(this);
    if (bVar3) {
      local_1d0 = (ON_SurfaceCurvature *)ON_SimpleArray<ON_Color>::Array(&this->m_C);
    }
    else {
      local_1d0 = (ON_SurfaceCurvature *)0x0;
    }
    mp.K = local_1d0;
    bVar3 = HasPrincipalCurvatures(this);
    if (bVar3) {
      local_1e8 = ON_SimpleArray<ON_SurfaceCurvature>::Array(&this->m_K);
    }
    else {
      local_1e8 = (ON_SurfaceCurvature *)0x0;
    }
    mp.N = (ON_3fVector *)local_1e8;
    if (bIgnoreVertexNormals) {
      mp.T = (ON_2fPoint *)0x0;
    }
    if (bIgnoreTextureCoordinates) {
      mp.V = (ON_3fPoint *)0x0;
      mp.K = (ON_SurfaceCurvature *)0x0;
      mp.N = (ON_3fVector *)0x0;
    }
    ON_SimpleArray<int>::SetCount((ON_SimpleArray<int> *)&remap_array.m_count,iVar4);
    ON_SimpleArray<int>::Zero((ON_SimpleArray<int> *)&remap_array.m_count);
    index_00 = ON_SimpleArray<int>::Array((ON_SimpleArray<int> *)&remap_array.m_count);
    ON_SimpleArray<int>::SetCount((ON_SimpleArray<int> *)local_58,iVar4);
    p_array._16_8_ = ON_SimpleArray<int>::Array((ON_SimpleArray<int> *)local_58);
    for (mp.C._0_4_ = 0; (int)mp.C < iVar4; mp.C._0_4_ = (int)mp.C + 1) {
      *(int *)(p_array._16_8_ + (long)(int)mp.C * 4) = -1;
    }
    ON_Sort(quick_sort,index_00,index,(long)iVar4,1,CompareMeshPoint,&index);
    k = 0;
    while (iVar6 = k, k < iVar4) {
      do {
        mp.C._4_4_ = iVar6 + 1;
        if (iVar4 <= mp.C._4_4_) break;
        iVar5 = CompareMeshPoint((void *)((long)index + (long)index_00[k]),
                                 (void *)((long)index + (long)index_00[mp.C._4_4_]),&index);
        iVar6 = mp.C._4_4_;
      } while (iVar5 == 0);
      for (; k < mp.C._4_4_; k = k + 1) {
        *(int *)(p_array._16_8_ + (long)index_00[k] * 4) = i0;
      }
      i0 = i0 + 1;
      k = mp.C._4_4_;
    }
    if (bIgnoreVertexNormals) {
      bVar3 = HasVertexNormals(this);
      if (bVar3) {
        local_210 = ON_SimpleArray<ON_3fVector>::Array
                              (&(this->m_N).super_ON_SimpleArray<ON_3fVector>);
      }
      else {
        local_210 = (ON_3fVector *)0x0;
      }
      mp.T = (ON_2fPoint *)local_210;
    }
    if (bIgnoreTextureCoordinates) {
      bVar3 = HasTextureCoordinates(this);
      if (bVar3) {
        local_228 = (ON_3fPoint *)
                    ON_SimpleArray<ON_2fPoint>::Array(&(this->m_T).super_ON_SimpleArray<ON_2fPoint>)
        ;
      }
      else {
        local_228 = (ON_3fPoint *)0x0;
      }
      mp.V = local_228;
      bVar3 = HasVertexColors(this);
      if (bVar3) {
        local_240 = (ON_SurfaceCurvature *)ON_SimpleArray<ON_Color>::Array(&this->m_C);
      }
      else {
        local_240 = (ON_SurfaceCurvature *)0x0;
      }
      mp.K = local_240;
      bVar3 = HasPrincipalCurvatures(this);
      if (bVar3) {
        local_258 = ON_SimpleArray<ON_SurfaceCurvature>::Array(&this->m_K);
      }
      else {
        local_258 = (ON_SurfaceCurvature *)0x0;
      }
      mp.N = (ON_3fVector *)local_258;
    }
    if ((0 < i0) && (i0 < iVar4)) {
      ON_SimpleArray<ON_3fPoint>::ON_SimpleArray((ON_SimpleArray<ON_3fPoint> *)&p,(long)i0);
      ON_SimpleArray<ON_3fPoint>::SetCount((ON_SimpleArray<ON_3fPoint> *)&p,i0);
      pOVar7 = ON_SimpleArray<ON_3fPoint>::Array((ON_SimpleArray<ON_3fPoint> *)&p);
      for (mp.C._0_4_ = 0; (int)mp.C < iVar4; mp.C._0_4_ = (int)mp.C + 1) {
        pOVar8 = pOVar7 + *(int *)(p_array._16_8_ + (long)(int)mp.C * 4);
        uVar1 = *(undefined8 *)(mp.p0 + (long)(int)mp.C * 0xc);
        pOVar8->x = (float)(int)uVar1;
        pOVar8->y = (float)(int)((ulong)uVar1 >> 0x20);
        pOVar8->z = *(float *)(mp.p0 + (long)(int)mp.C * 0xc + 8);
      }
      for (mp.C._0_4_ = 0; (int)mp.C < i0; mp.C._0_4_ = (int)mp.C + 1) {
        *(undefined8 *)(mp.p0 + (long)(int)mp.C * 0xc) = *(undefined8 *)(pOVar7 + (int)mp.C);
        *(float *)(mp.p0 + (long)(int)mp.C * 0xc + 8) = pOVar7[(int)mp.C].z;
      }
      dp_array._16_8_ = pOVar7;
      ON_SimpleArray<ON_3fPoint>::SetCount(&(this->m_V).super_ON_SimpleArray<ON_3fPoint>,i0);
      iVar6 = ON_SimpleArray<ON_3dPoint>::Count(&(this->m_dV).super_ON_SimpleArray<ON_3dPoint>);
      if (iVar4 == iVar6) {
        ON_SimpleArray<ON_3dPoint>::ON_SimpleArray((ON_SimpleArray<ON_3dPoint> *)&dp);
        pOVar9 = ON_SimpleArray<ON_3dPoint>::Reserve((ON_SimpleArray<ON_3dPoint> *)&dp,(long)i0);
        c_array._16_8_ =
             ON_SimpleArray<ON_3dPoint>::Array(&(this->m_dV).super_ON_SimpleArray<ON_3dPoint>);
        for (mp.C._0_4_ = 0; (int)mp.C < iVar4; mp.C._0_4_ = (int)mp.C + 1) {
          pOVar16 = (ON_3dPoint *)(c_array._16_8_ + (long)(int)mp.C * 0x18);
          pOVar10 = pOVar9 + *(int *)(p_array._16_8_ + (long)(int)mp.C * 4);
          pOVar10->x = pOVar16->x;
          pOVar10->y = pOVar16->y;
          pOVar10->z = pOVar16->z;
        }
        for (mp.C._0_4_ = 0; (int)mp.C < i0; mp.C._0_4_ = (int)mp.C + 1) {
          pOVar16 = pOVar9 + (int)mp.C;
          pOVar10 = (ON_3dPoint *)(c_array._16_8_ + (long)(int)mp.C * 0x18);
          pOVar10->x = pOVar16->x;
          pOVar10->y = pOVar16->y;
          pOVar10->z = pOVar16->z;
        }
        ON_SimpleArray<ON_3dPoint>::SetCount(&(this->m_dV).super_ON_SimpleArray<ON_3dPoint>,i0);
        ON_SimpleArray<ON_3dPoint>::~ON_SimpleArray((ON_SimpleArray<ON_3dPoint> *)&dp);
      }
      else {
        ON_SimpleArray<ON_3dPoint>::Destroy(&(this->m_dV).super_ON_SimpleArray<ON_3dPoint>);
      }
      if (mp.T == (ON_2fPoint *)0x0) {
        ON_SimpleArray<ON_3fVector>::SetCount(&(this->m_N).super_ON_SimpleArray<ON_3fVector>,0);
      }
      else {
        if (bIgnoreVertexNormals) {
          ON_SimpleArray<ON_3fPoint>::Zero((ON_SimpleArray<ON_3fPoint> *)&p);
          for (mp.C._0_4_ = 0; (int)mp.C < iVar4; mp.C._0_4_ = (int)mp.C + 1) {
            ON_3fVector::operator+=
                      ((ON_3fVector *)
                       (dp_array._16_8_ + (long)*(int *)(p_array._16_8_ + (long)(int)mp.C * 4) * 0xc
                       ),(ON_3fVector *)((long)mp.T + (long)(int)mp.C * 0xc));
          }
          for (mp.C._0_4_ = 0; (int)mp.C < i0; mp.C._0_4_ = (int)mp.C + 1) {
            ON_3fVector::Unitize((ON_3fVector *)(dp_array._16_8_ + (long)(int)mp.C * 0xc));
          }
        }
        else {
          for (mp.C._0_4_ = 0; (int)mp.C < iVar4; mp.C._0_4_ = (int)mp.C + 1) {
            puVar17 = (undefined8 *)((long)mp.T + (long)(int)mp.C * 0xc);
            puVar11 = (undefined8 *)
                      (dp_array._16_8_ + (long)*(int *)(p_array._16_8_ + (long)(int)mp.C * 4) * 0xc)
            ;
            *puVar11 = *puVar17;
            *(undefined4 *)(puVar11 + 1) = *(undefined4 *)(puVar17 + 1);
          }
        }
        for (mp.C._0_4_ = 0; (int)mp.C < i0; mp.C._0_4_ = (int)mp.C + 1) {
          puVar17 = (undefined8 *)(dp_array._16_8_ + (long)(int)mp.C * 0xc);
          puVar11 = (undefined8 *)((long)mp.T + (long)(int)mp.C * 0xc);
          *puVar11 = *puVar17;
          *(undefined4 *)(puVar11 + 1) = *(undefined4 *)(puVar17 + 1);
        }
        ON_SimpleArray<ON_3fVector>::SetCount(&(this->m_N).super_ON_SimpleArray<ON_3fVector>,i0);
      }
      if ((mp.V == (ON_3fPoint *)0x0) || (bIgnoreTextureCoordinates)) {
        ON_SimpleArray<ON_2fPoint>::SetCount(&(this->m_T).super_ON_SimpleArray<ON_2fPoint>,0);
      }
      else {
        for (mp.C._0_4_ = 0; (int)mp.C < iVar4; mp.C._0_4_ = (int)mp.C + 1) {
          ON_3fPoint::operator=
                    (pOVar7 + *(int *)(p_array._16_8_ + (long)(int)mp.C * 4),
                     (ON_2fPoint *)(&(mp.V)->x + (long)(int)mp.C * 2));
        }
        for (mp.C._0_4_ = 0; (int)mp.C < i0; mp.C._0_4_ = (int)mp.C + 1) {
          ON_2fPoint::operator=((ON_2fPoint *)(&(mp.V)->x + (long)(int)mp.C * 2),pOVar7 + (int)mp.C)
          ;
        }
        ON_SimpleArray<ON_2fPoint>::SetCount(&(this->m_T).super_ON_SimpleArray<ON_2fPoint>,i0);
      }
      if ((mp.K == (ON_SurfaceCurvature *)0x0) || (bIgnoreTextureCoordinates)) {
        ON_SimpleArray<ON_Color>::SetCount(&this->m_C,0);
      }
      else {
        ON_SimpleArray<ON_Color>::ON_SimpleArray((ON_SimpleArray<ON_Color> *)&c,(long)i0);
        ON_SimpleArray<ON_Color>::SetCount((ON_SimpleArray<ON_Color> *)&c,i0);
        s_array._16_8_ = ON_SimpleArray<ON_Color>::Array((ON_SimpleArray<ON_Color> *)&c);
        for (mp.C._0_4_ = 0; (int)mp.C < iVar4; mp.C._0_4_ = (int)mp.C + 1) {
          *(anon_union_4_2_6147a14e_for_ON_Color_15 *)
           (s_array._16_8_ + (long)*(int *)(p_array._16_8_ + (long)(int)mp.C * 4) * 4) =
               *(anon_union_4_2_6147a14e_for_ON_Color_15 *)((long)&(mp.K)->k1 + (long)(int)mp.C * 4)
          ;
        }
        for (mp.C._0_4_ = 0; (int)mp.C < i0; mp.C._0_4_ = (int)mp.C + 1) {
          *(anon_union_4_2_6147a14e_for_ON_Color_15 *)((long)&(mp.K)->k1 + (long)(int)mp.C * 4) =
               *(anon_union_4_2_6147a14e_for_ON_Color_15 *)(s_array._16_8_ + (long)(int)mp.C * 4);
        }
        ON_SimpleArray<ON_Color>::SetCount(&this->m_C,i0);
        ON_SimpleArray<ON_Color>::~ON_SimpleArray((ON_SimpleArray<ON_Color> *)&c);
      }
      if ((mp.N == (ON_3fVector *)0x0) || (bIgnoreTextureCoordinates)) {
        ON_SimpleArray<ON_SurfaceCurvature>::SetCount(&this->m_K,0);
      }
      else {
        ON_SimpleArray<ON_SurfaceCurvature>::ON_SimpleArray
                  ((ON_SimpleArray<ON_SurfaceCurvature> *)&s,(long)i0);
        ON_SimpleArray<ON_SurfaceCurvature>::SetCount((ON_SimpleArray<ON_SurfaceCurvature> *)&s,i0);
        pOVar12 = ON_SimpleArray<ON_SurfaceCurvature>::Array
                            ((ON_SimpleArray<ON_SurfaceCurvature> *)&s);
        for (mp.C._0_4_ = 0; (int)mp.C < iVar4; mp.C._0_4_ = (int)mp.C + 1) {
          pdVar18 = (double *)((long)mp.N + (long)(int)mp.C * 0x10);
          iVar6 = *(int *)(p_array._16_8_ + (long)(int)mp.C * 4);
          pOVar12[iVar6].k1 = *pdVar18;
          pOVar12[iVar6].k2 = pdVar18[1];
        }
        for (mp.C._0_4_ = 0; (int)mp.C < i0; mp.C._0_4_ = (int)mp.C + 1) {
          pdVar18 = (double *)((long)mp.N + (long)(int)mp.C * 0x10);
          *pdVar18 = pOVar12[(int)mp.C].k1;
          pdVar18[1] = pOVar12[(int)mp.C].k2;
        }
        ON_SimpleArray<ON_SurfaceCurvature>::SetCount(&this->m_K,i0);
        ON_SimpleArray<ON_SurfaceCurvature>::~ON_SimpleArray
                  ((ON_SimpleArray<ON_SurfaceCurvature> *)&s);
      }
      iVar4 = ON_SimpleArray<ON_MeshFace>::Count(&this->m_F);
      pOVar13 = ON_SimpleArray<ON_MeshFace>::Array(&this->m_F);
      for (mp.C._0_4_ = 0; (int)mp.C < iVar4; mp.C._0_4_ = (int)mp.C + 1) {
        pOVar14 = pOVar13 + (int)mp.C;
        pOVar14->vi[0] = *(int *)(p_array._16_8_ + (long)pOVar14->vi[0] * 4);
        pOVar14->vi[1] = *(int *)(p_array._16_8_ + (long)pOVar14->vi[1] * 4);
        pOVar14->vi[2] = *(int *)(p_array._16_8_ + (long)pOVar14->vi[2] * 4);
        pOVar14->vi[3] = *(int *)(p_array._16_8_ + (long)pOVar14->vi[3] * 4);
      }
      bVar3 = HasNgons(this);
      if (bVar3) {
        for (ngon._4_4_ = 0; iVar4 = ON_SimpleArray<ON_MeshNgon_*>::Count(&this->m_Ngon),
            ngon._4_4_ < iVar4; ngon._4_4_ = ngon._4_4_ + 1) {
          ppOVar15 = ON_SimpleArray<ON_MeshNgon_*>::operator[](&this->m_Ngon,ngon._4_4_);
          pOVar2 = *ppOVar15;
          if (pOVar2 != (ON_MeshNgon *)0x0) {
            for (local_174 = 0; local_174 < pOVar2->m_Vcount; local_174 = local_174 + 1) {
              pOVar2->m_vi[local_174] =
                   *(uint *)(p_array._16_8_ + (ulong)pOVar2->m_vi[local_174] * 4);
            }
          }
        }
      }
      DestroyPartition(this);
      DestroyTopology(this);
      ON_SimpleArray<ON_2dPoint>::Destroy(&(this->m_S).super_ON_SimpleArray<ON_2dPoint>);
      iVar4 = ON_SimpleArray<ON_3fPoint>::Capacity(&(this->m_V).super_ON_SimpleArray<ON_3fPoint>);
      iVar6 = ON_SimpleArray<ON_3fPoint>::Count(&(this->m_V).super_ON_SimpleArray<ON_3fPoint>);
      if ((iVar6 * 4 < iVar4) &&
         (iVar4 = ON_SimpleArray<ON_3fPoint>::Capacity
                            (&(this->m_V).super_ON_SimpleArray<ON_3fPoint>), 0x32 < iVar4)) {
        Compact(this);
      }
      mesh._5_1_ = true;
      ON_SimpleArray<ON_3fPoint>::~ON_SimpleArray((ON_SimpleArray<ON_3fPoint> *)&p);
    }
    ON_SimpleArray<int>::~ON_SimpleArray((ON_SimpleArray<int> *)local_58);
    ON_SimpleArray<int>::~ON_SimpleArray((ON_SimpleArray<int> *)&remap_array.m_count);
  }
  return mesh._5_1_;
}

Assistant:

bool ON_Mesh::CombineIdenticalVertices(
                                bool bIgnoreVertexNormals,
                                bool bIgnoreTextureCoordinates
                                )
{
  // 11 June 2003 - added and tested.
  bool rc = false;
  ON_Mesh& mesh = *this;

  int vertex_count = mesh.m_V.Count();
  if ( vertex_count > 0 )
  {
    ON_SimpleArray<int> index_array(vertex_count);
    ON_SimpleArray<int> remap_array(vertex_count);

    int remap_vertex_count = 0;
    int merge_count = 0;
    int i0, i1, k;

    struct tagMESHPOINTS mp;
    memset(&mp,0,sizeof(mp));
    mp.p0 = (const char*)&mp; // bogus pointer - never dereferenced
    mp.V = mesh.m_V.Array();
    mp.N = mesh.HasVertexNormals()       ? mesh.m_N.Array() : 0;
    mp.T = mesh.HasTextureCoordinates()  ? mesh.m_T.Array() : 0;
    mp.C = mesh.HasVertexColors()        ? mesh.m_C.Array() : 0;
    mp.K = mesh.HasPrincipalCurvatures() ? mesh.m_K.Array() : 0;

    if ( bIgnoreVertexNormals )
    {
      mp.N = 0;
    }

    if ( bIgnoreTextureCoordinates )
    {
      mp.T = 0;
      mp.C = 0;
      mp.K = 0;
    }

    index_array.SetCount(vertex_count);
    index_array.Zero();
    int* index = index_array.Array();

    remap_array.SetCount(vertex_count);
    int* remap = remap_array.Array();
    for ( k = 0; k < vertex_count; k++ )
      remap[k] = -1;

    ON_Sort( 
          ON::sort_algorithm::quick_sort,
          index,
          mp.p0,                 // data buffer
          vertex_count,
          sizeof(*mp.p0),
          CompareMeshPoint,
          &mp
         );

    for ( i0 = 0; i0 < vertex_count; i0 = i1 )
    {
      for ( i1 = i0+1; i1 < vertex_count; i1++ )
      {
        if ( CompareMeshPoint( mp.p0+index[i0], mp.p0+index[i1], &mp ) )
          break;
        else
          merge_count++;
      }
      for ( /*empty*/; i0 < i1; i0++ )
      {
        remap[index[i0]] = remap_vertex_count;
      }
      remap_vertex_count++;
    }

    if ( bIgnoreVertexNormals )
    {
      mp.N = mesh.HasVertexNormals() ? mesh.m_N.Array() : 0;
    }

    if ( bIgnoreTextureCoordinates )
    {
      mp.T = mesh.HasTextureCoordinates()  ? mesh.m_T.Array() : 0;
      mp.C = mesh.HasVertexColors()        ? mesh.m_C.Array() : 0;
      mp.K = mesh.HasPrincipalCurvatures() ? mesh.m_K.Array() : 0;
    }

    if ( remap_vertex_count > 0 && remap_vertex_count < vertex_count )
    {
      ON_SimpleArray<ON_3fPoint> p_array(remap_vertex_count);
      p_array.SetCount(remap_vertex_count);
      ON_3fPoint* p = p_array.Array();
      ON_3fVector* v = (ON_3fVector*)p;

      for ( k = 0; k < vertex_count; k++ )
      {
        p[remap[k]] = mp.V[k];
      }
      for ( k = 0; k < remap_vertex_count; k++ )
        mp.V[k] = p[k];
      mesh.m_V.SetCount(remap_vertex_count);

      if (vertex_count == m_dV.Count())
      {
        ON_SimpleArray<ON_3dPoint> dp_array;
        ON_3dPoint* dp = dp_array.Reserve(remap_vertex_count);
        ON_3dPoint* D = m_dV.Array();
        for (k = 0; k < vertex_count; k++)
        {
          dp[remap[k]] = D[k];
        }
        for (k = 0; k < remap_vertex_count; k++)
          D[k] = dp[k];
        m_dV.SetCount(remap_vertex_count);
      }
      else
        m_dV.Destroy();

      if ( 0 != mp.N )
      {
        if ( bIgnoreVertexNormals )
        {
          // average vertex normals of combined vertices
          p_array.Zero();
          for ( k = 0; k < vertex_count; k++ )
          {
            v[remap[k]] += mp.N[k];
          }
          for ( k = 0; k < remap_vertex_count; k++ )
          {
            v[k].Unitize();
          }
        }
        else
        {
          for ( k = 0; k < vertex_count; k++ )
          {
            v[remap[k]] = mp.N[k];
          }
        }
        for ( k = 0; k < remap_vertex_count; k++ )
          mp.N[k] = v[k];
        mesh.m_N.SetCount(remap_vertex_count);
      }
      else
        mesh.m_N.SetCount(0);

      if ( 0 != mp.T && !bIgnoreTextureCoordinates )
      {
        for ( k = 0; k < vertex_count; k++ )
        {
          p[remap[k]] = mp.T[k];
        }
        for ( k = 0; k < remap_vertex_count; k++ )
          mp.T[k] = p[k];
        mesh.m_T.SetCount(remap_vertex_count);
      }
      else
        mesh.m_T.SetCount(0);

      if ( 0 != mp.C && !bIgnoreTextureCoordinates )
      {
        ON_SimpleArray<ON_Color> c_array(remap_vertex_count);
        c_array.SetCount(remap_vertex_count);
        ON_Color* c = c_array.Array();
        for ( k = 0; k < vertex_count; k++ )
        {
          c[remap[k]] = mp.C[k];
        }
        for ( k = 0; k < remap_vertex_count; k++ )
          mp.C[k] = c[k];
        mesh.m_C.SetCount(remap_vertex_count);
      }
      else
        mesh.m_C.SetCount(0);

      if ( 0 != mp.K && !bIgnoreTextureCoordinates )
      {
        ON_SimpleArray<ON_SurfaceCurvature> s_array(remap_vertex_count);
        s_array.SetCount(remap_vertex_count);
        ON_SurfaceCurvature* s = s_array.Array();
        for ( k = 0; k < vertex_count; k++ )
        {
          s[remap[k]] = mp.K[k];
        }
        for ( k = 0; k < remap_vertex_count; k++ )
          mp.K[k] = s[k];
        mesh.m_K.SetCount(remap_vertex_count);
      }
      else
        mesh.m_K.SetCount(0);

      const int face_count = mesh.m_F.Count();
      ON_MeshFace* f = mesh.m_F.Array();
      int* fvi;
      for ( k = 0; k < face_count; k++ )
      {
        fvi = f[k].vi;
        fvi[0] = remap[fvi[0]];
        fvi[1] = remap[fvi[1]];
        fvi[2] = remap[fvi[2]];
        fvi[3] = remap[fvi[3]];
      }

      if ( HasNgons() )
      {
        for ( int ngon_index = 0; ngon_index < m_Ngon.Count(); ngon_index++ )
        {
          ON_MeshNgon* ngon = m_Ngon[ngon_index];
          if ( 0 == ngon )
            continue;
          for ( unsigned int ngon_vertex_index = 0; ngon_vertex_index < ngon->m_Vcount; ngon_vertex_index++ )
            ngon->m_vi[ngon_vertex_index] = remap[ngon->m_vi[ngon_vertex_index]];
        }
      }

      //if (0 != V4V5_NgonList())
      //{
      //  //This mesh has an ngon list.
      //  //Modify the vertex indexes in the ngons as 
      //  //we did the faces above
      //  ON_V4V5_MeshNgonList* ngonlist = V4V5_ModifyNgonList();
      //  int kk, kkct = ngonlist->V4V5_NgonCount();
      //  for (kk = 0; kk < kkct; kk++)
      //  {
      //    ON_MeshNgon* ngon = ngonlist->V4V5_Ngon(kk);
      //    if (0 == ngon)
      //      continue;
      //    for ( k = 0; k < ngon->m_N; k++ )
      //      ngon->m_vi[k] = remap[ngon->m_vi[k]];
      //  }
      //}

      mesh.DestroyPartition();
      mesh.DestroyTopology();
      mesh.m_S.Destroy();

      if ( mesh.m_V.Capacity() > 4*mesh.m_V.Count() && mesh.m_V.Capacity() > 50 )
      {
        // There is lots of unused memory in the dynamic arrays.
        // Release what we can.
        mesh.Compact();
      }
      rc = true;
    }
  }
  return rc;
}